

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O0

int32_t bf_get_int32_be(bfile_t *bfile)

{
  int8_t iVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bfile_t *in_RDI;
  int32_t val;
  bfile_t *in_stack_ffffffffffffffe8;
  
  iVar1 = bf_get_int8(in_stack_ffffffffffffffe8);
  bVar2 = bf_get_uint8(in_RDI);
  bVar3 = bf_get_uint8(in_RDI);
  bVar4 = bf_get_uint8(in_RDI);
  return (uint)bVar4 | (uint)bVar3 << 8 | (uint)bVar2 << 0x10 | (int)iVar1 << 0x18;
}

Assistant:

int32_t
bf_get_int32_be(
    bfile_t * bfile )
{
    int32_t val;
    val = bf_get_int8( bfile ) << 24;
    val |= bf_get_uint8( bfile ) << 16;
    val |= bf_get_uint8( bfile ) << 8;
    val |= bf_get_uint8( bfile );
    return val;
}